

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::Statement(SQCompiler *this,bool closeframe)

{
  long lVar1;
  SQInteger SVar2;
  bool bVar3;
  SQInteger SVar4;
  SQUnsignedInteger SVar5;
  longlong *plVar6;
  SQInteger SVar7;
  SQInteger SVar8;
  byte in_SIL;
  SQCompiler *in_RDI;
  SQObject SVar9;
  SQCompiler *in_stack_00000010;
  SQCompiler *in_stack_00000040;
  SQObjectPtr strongid;
  SQTable *enums;
  SQObject val;
  SQObject id;
  SQInteger oldouters;
  SQScope __oldscope__;
  SQInteger retexp;
  SQOpcode op;
  longlong *in_stack_fffffffffffffed8;
  SQCompiler *in_stack_fffffffffffffee0;
  SQTable *this_00;
  SQInteger in_stack_fffffffffffffee8;
  SQFuncState *pSVar10;
  SQCompiler *in_stack_fffffffffffffef0;
  SQFuncState *in_stack_fffffffffffffef8;
  SQFuncState *in_stack_ffffffffffffff00;
  SQObjectPtr *in_stack_ffffffffffffff08;
  SQOpcode SVar11;
  SQCompiler *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  SQCompiler *in_stack_ffffffffffffff30;
  SQCompiler *in_stack_ffffffffffffff50;
  SQObjectPtr local_a8;
  SQObjectValue in_stack_ffffffffffffff70;
  SQObjectType in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  SQObjectValue in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SQObjectType local_60;
  SQCompiler *in_stack_ffffffffffffffc0;
  SQCompiler *in_stack_ffffffffffffffe0;
  int local_10;
  
  SQFuncState::AddLineInfos
            (in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
             SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffef0 >> 0x30,0));
  lVar1 = in_RDI->_token;
  if (lVar1 == 0x3b) {
    Lex(in_stack_fffffffffffffee0);
  }
  else if (lVar1 == 0x7b) {
    SVar4 = (in_RDI->_scope).outers;
    SVar2 = (in_RDI->_scope).stacksize;
    (in_RDI->_scope).outers = in_RDI->_fs->_outers;
    SVar7 = SQFuncState::GetStackSize((SQFuncState *)0x118775);
    SVar11 = (SQOpcode)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    (in_RDI->_scope).stacksize = SVar7;
    Lex(in_stack_fffffffffffffee0);
    Statements(in_stack_fffffffffffffee0);
    Expect((SQCompiler *)in_stack_ffffffffffffff88.pTable,
           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if ((in_SIL & 1) == 0) {
      SVar7 = SQFuncState::GetStackSize((SQFuncState *)0x118874);
      if (SVar7 != (in_RDI->_scope).stacksize) {
        SQFuncState::SetStackSize
                  ((SQFuncState *)in_stack_ffffffffffffff30,
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      (in_RDI->_scope).outers = SVar4;
      (in_RDI->_scope).stacksize = SVar2;
    }
    else {
      SVar7 = in_RDI->_fs->_outers;
      SVar8 = SQFuncState::GetStackSize((SQFuncState *)0x1187dd);
      if ((SVar8 != (in_RDI->_scope).stacksize) &&
         (SQFuncState::SetStackSize
                    ((SQFuncState *)in_stack_ffffffffffffff30,
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
         SVar7 != in_RDI->_fs->_outers)) {
        SQFuncState::AddInstruction
                  ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                   (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                   (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      (in_RDI->_scope).outers = SVar4;
      (in_RDI->_scope).stacksize = SVar2;
    }
  }
  else if (lVar1 == 0x10c) {
    SwitchStatement(in_stack_ffffffffffffffe0);
  }
  else if (lVar1 == 0x110) {
    IfStatement(in_stack_ffffffffffffff30);
  }
  else if (lVar1 == 0x112) {
    WhileStatement((SQCompiler *)in_stack_ffffffffffffff70.pTable);
  }
  else if (lVar1 == 0x113) {
    SVar5 = sqvector<long_long>::size(&in_RDI->_fs->_breaktargets);
    SVar11 = (SQOpcode)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (SVar5 == 0) {
      Error(in_RDI,"\'break\' has to be in a loop block");
    }
    plVar6 = sqvector<long_long>::top(&in_RDI->_fs->_breaktargets);
    if (0 < *plVar6) {
      SVar11 = (SQOpcode)((ulong)in_RDI->_fs >> 0x20);
      sqvector<long_long>::top(&in_RDI->_fs->_breaktargets);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                 (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
    SVar4 = SQFuncState::GetStackSize((SQFuncState *)0x118506);
    if ((SVar4 != (in_RDI->_scope).stacksize) &&
       (SVar4 = SQFuncState::CountOuters
                          (in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8),
       SVar4 != 0)) {
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                 (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
    SQFuncState::AddInstruction
              ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,(SQInteger)in_stack_ffffffffffffff00,
               (SQInteger)in_stack_fffffffffffffef8,(SQInteger)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
    SQFuncState::GetCurrentPos((SQFuncState *)0x118596);
    sqvector<long_long>::push_back
              ((sqvector<long_long> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    Lex(in_stack_fffffffffffffee0);
  }
  else if (lVar1 == 0x114) {
    ForStatement(in_stack_00000040);
  }
  else if (lVar1 == 0x115) {
    DoWhileStatement((SQCompiler *)in_stack_ffffffffffffff70.pTable);
  }
  else if (lVar1 == 0x117) {
    ForEachStatement(in_stack_00000010);
  }
  else if (lVar1 == 0x11b) {
    LocalDeclStatement((SQCompiler *)0x11b);
  }
  else if (lVar1 == 0x11d) {
    FunctionStatement(in_stack_ffffffffffffff50);
  }
  else {
    if (lVar1 != 0x11e) {
      if (lVar1 == 0x123) {
        SVar5 = sqvector<long_long>::size(&in_RDI->_fs->_continuetargets);
        SVar11 = (SQOpcode)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        if (SVar5 == 0) {
          Error(in_RDI,"\'continue\' has to be in a loop block");
        }
        plVar6 = sqvector<long_long>::top(&in_RDI->_fs->_continuetargets);
        if (0 < *plVar6) {
          in_stack_fffffffffffffef8 = in_RDI->_fs;
          sqvector<long_long>::top(&in_RDI->_fs->_continuetargets);
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                     (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                     (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        }
        SVar4 = SQFuncState::GetStackSize((SQFuncState *)0x118651);
        if ((SVar4 != (in_RDI->_scope).stacksize) &&
           (SVar4 = SQFuncState::CountOuters
                              (in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8),
           SVar4 != 0)) {
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                     (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                     (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        }
        SQFuncState::AddInstruction
                  ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                   (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                   (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        SQFuncState::GetCurrentPos((SQFuncState *)0x1186e1);
        sqvector<long_long>::push_back
                  ((sqvector<long_long> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        Lex(in_stack_fffffffffffffee0);
        goto LAB_00118a75;
      }
      if (lVar1 != 0x124) {
        if (lVar1 == 0x125) {
          TryCatchStatement((SQCompiler *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
        else if (lVar1 == 0x127) {
          Lex(in_stack_fffffffffffffee0);
          SVar11 = (SQOpcode)((ulong)in_stack_ffffffffffffff08 >> 0x20);
          CommaExpr(in_stack_fffffffffffffee0);
          pSVar10 = in_RDI->_fs;
          SQFuncState::PopTarget((SQFuncState *)in_stack_fffffffffffffef0);
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                     (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                     (SQInteger)in_stack_fffffffffffffef0,(SQInteger)pSVar10);
        }
        else if (lVar1 == 0x133) {
          ClassStatement(in_stack_fffffffffffffef0);
        }
        else if (lVar1 == 0x143) {
          EnumStatement(in_stack_ffffffffffffffc0);
        }
        else if (lVar1 == 0x144) {
          Lex(in_stack_fffffffffffffee0);
          SVar9 = Expect((SQCompiler *)in_stack_ffffffffffffff88.pTable,
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          local_60 = SVar9._type;
          Expect((SQCompiler *)in_stack_ffffffffffffff88.pTable,
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          ExpectScalar(in_stack_ffffffffffffff10);
          OptionalSemicolon(in_stack_fffffffffffffee0);
          this_00 = (in_RDI->_vm->_sharedstate->_consts).super_SQObject._unVal.pTable;
          ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff68,(SQObject *)&local_60);
          ::SQObjectPtr::SQObjectPtr(&local_a8,(SQObject *)&stack0xffffffffffffff80);
          SQTable::NewSlot((SQTable *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (SQObjectPtr *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
          ::SQObjectPtr::Null((SQObjectPtr *)this_00);
          ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
        }
        else {
          CommaExpr(in_stack_fffffffffffffee0);
          SQFuncState::DiscardTarget(in_stack_ffffffffffffff00);
        }
        goto LAB_00118a75;
      }
    }
    if (in_RDI->_token == 0x11e) {
      local_10 = 0x17;
    }
    else {
      local_10 = 0x31;
      in_RDI->_fs->_bgenerator = true;
    }
    Lex(in_stack_fffffffffffffee0);
    SVar11 = (SQOpcode)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    bVar3 = IsEndOfStatement(in_RDI);
    if (bVar3) {
      if ((local_10 == 0x17) && (0 < in_RDI->_fs->_traps)) {
        SQFuncState::AddInstruction
                  ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                   (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                   (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      in_RDI->_fs->_returnexp = -1;
      pSVar10 = in_RDI->_fs;
      SQFuncState::GetStackSize((SQFuncState *)0x118451);
      SQFuncState::AddInstruction
                (pSVar10,SVar11,(SQInteger)in_stack_ffffffffffffff00,
                 (SQInteger)in_stack_fffffffffffffef8,(SQInteger)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
    }
    else {
      SVar4 = SQFuncState::GetCurrentPos((SQFuncState *)0x118316);
      CommaExpr(in_stack_fffffffffffffee0);
      if ((local_10 == 0x17) && (0 < in_RDI->_fs->_traps)) {
        SQFuncState::AddInstruction
                  ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                   (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                   (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      in_RDI->_fs->_returnexp = SVar4 + 1;
      SQFuncState::PopTarget((SQFuncState *)in_stack_fffffffffffffef0);
      SQFuncState::GetStackSize((SQFuncState *)0x1183b9);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_ffffffffffffff10,SVar11,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8,
                 (SQInteger)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
LAB_00118a75:
  SQFuncState::SnoozeOpt(in_RDI->_fs);
  return;
}

Assistant:

void Statement(bool closeframe = true)
    {
        _fs->AddLineInfos(_lex._currentline, _lineinfo);
        switch(_token){
        case _SC(';'):  Lex();                  break;
        case TK_IF:     IfStatement();          break;
        case TK_WHILE:      WhileStatement();       break;
        case TK_DO:     DoWhileStatement();     break;
        case TK_FOR:        ForStatement();         break;
        case TK_FOREACH:    ForEachStatement();     break;
        case TK_SWITCH: SwitchStatement();      break;
        case TK_LOCAL:      LocalDeclStatement();   break;
        case TK_RETURN:
        case TK_YIELD: {
            SQOpcode op;
            if(_token == TK_RETURN) {
                op = _OP_RETURN;
            }
            else {
                op = _OP_YIELD;
                _fs->_bgenerator = true;
            }
            Lex();
            if(!IsEndOfStatement()) {
                SQInteger retexp = _fs->GetCurrentPos()+1;
                CommaExpr();
                if(op == _OP_RETURN && _fs->_traps > 0)
                    _fs->AddInstruction(_OP_POPTRAP, _fs->_traps, 0);
                _fs->_returnexp = retexp;
                _fs->AddInstruction(op, 1, _fs->PopTarget(),_fs->GetStackSize());
            }
            else{
                if(op == _OP_RETURN && _fs->_traps > 0)
                    _fs->AddInstruction(_OP_POPTRAP, _fs->_traps ,0);
                _fs->_returnexp = -1;
                _fs->AddInstruction(op, 0xFF,0,_fs->GetStackSize());
            }
            break;}
        case TK_BREAK:
            if(_fs->_breaktargets.size() <= 0)Error(_SC("'break' has to be in a loop block"));
            if(_fs->_breaktargets.top() > 0){
                _fs->AddInstruction(_OP_POPTRAP, _fs->_breaktargets.top(), 0);
            }
            RESOLVE_OUTERS();
            _fs->AddInstruction(_OP_JMP, 0, -1234);
            _fs->_unresolvedbreaks.push_back(_fs->GetCurrentPos());
            Lex();
            break;
        case TK_CONTINUE:
            if(_fs->_continuetargets.size() <= 0)Error(_SC("'continue' has to be in a loop block"));
            if(_fs->_continuetargets.top() > 0) {
                _fs->AddInstruction(_OP_POPTRAP, _fs->_continuetargets.top(), 0);
            }
            RESOLVE_OUTERS();
            _fs->AddInstruction(_OP_JMP, 0, -1234);
            _fs->_unresolvedcontinues.push_back(_fs->GetCurrentPos());
            Lex();
            break;
        case TK_FUNCTION:
            FunctionStatement();
            break;
        case TK_CLASS:
            ClassStatement();
            break;
        case TK_ENUM:
            EnumStatement();
            break;
        case _SC('{'):{
                BEGIN_SCOPE();
                Lex();
                Statements();
                Expect(_SC('}'));
                if(closeframe) {
                    END_SCOPE();
                }
                else {
                    END_SCOPE_NO_CLOSE();
                }
            }
            break;
        case TK_TRY:
            TryCatchStatement();
            break;
        case TK_THROW:
            Lex();
            CommaExpr();
            _fs->AddInstruction(_OP_THROW, _fs->PopTarget());
            break;
        case TK_CONST:
            {
            Lex();
            SQObject id = Expect(TK_IDENTIFIER);
            Expect('=');
            SQObject val = ExpectScalar();
            OptionalSemicolon();
            SQTable *enums = _table(_ss(_vm)->_consts);
            SQObjectPtr strongid = id;
            enums->NewSlot(strongid,SQObjectPtr(val));
            strongid.Null();
            }
            break;
        default:
            CommaExpr();
            _fs->DiscardTarget();
            //_fs->PopTarget();
            break;
        }
        _fs->SnoozeOpt();
    }